

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * compatibilityType_abi_cxx11_(string *__return_storage_ptr__,CompatibleType t)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  switch(t) {
  case BoolType:
    pcVar2 = "Boolean compatibility";
    paVar1 = &local_9;
    break;
  case StringType:
    pcVar2 = "String compatibility";
    paVar1 = &local_a;
    break;
  case NumberMinType:
    pcVar2 = "Numeric minimum compatibility";
    paVar1 = &local_c;
    break;
  case NumberMaxType:
    pcVar2 = "Numeric maximum compatibility";
    paVar1 = &local_b;
    break;
  default:
    __assert_fail("0 && \"Unreachable!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmGeneratorTarget.cxx"
                  ,0x1008,"std::string compatibilityType(CompatibleType)");
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string compatibilityType(CompatibleType t)
{
  switch(t)
    {
    case BoolType:
      return "Boolean compatibility";
    case StringType:
      return "String compatibility";
    case NumberMaxType:
      return "Numeric maximum compatibility";
    case NumberMinType:
      return "Numeric minimum compatibility";
    }
  assert(0 && "Unreachable!");
  return "";
}